

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::Init(SQVM *this,SQVM *friendvm,SQInteger stacksize)

{
  SQUnsignedInteger newsize;
  CallInfo *pCVar1;
  SQTable *x;
  CallInfo local_88;
  SQObjectPtr local_30;
  SQInteger local_20;
  SQInteger stacksize_local;
  SQVM *friendvm_local;
  SQVM *this_local;
  
  local_20 = stacksize;
  stacksize_local = (SQInteger)friendvm;
  friendvm_local = this;
  ::SQObjectPtr::SQObjectPtr(&local_30);
  sqvector<SQObjectPtr>::resize(&this->_stack,stacksize,&local_30);
  ::SQObjectPtr::~SQObjectPtr(&local_30);
  this->_alloccallsstacksize = 4;
  newsize = this->_alloccallsstacksize;
  local_88._prevtop = 0;
  local_88._target = 0;
  local_88._ncalls = 0;
  local_88._60_4_ = 0;
  local_88._generator = (SQGenerator *)0x0;
  local_88._etraps = 0;
  local_88._prevstkbase = 0;
  local_88._closure.super_SQObject._type = 0;
  local_88._closure.super_SQObject._4_4_ = 0;
  local_88._closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_88._ip = (SQInstruction *)0x0;
  local_88._literals = (SQObjectPtr *)0x0;
  local_88._root = 0;
  CallInfo::CallInfo(&local_88);
  sqvector<SQVM::CallInfo>::resize(&this->_callstackdata,newsize,&local_88);
  CallInfo::~CallInfo(&local_88);
  this->_callsstacksize = 0;
  pCVar1 = sqvector<SQVM::CallInfo>::operator[](&this->_callstackdata,0);
  this->_callsstack = pCVar1;
  this->_stackbase = 0;
  this->_top = 0;
  if (stacksize_local == 0) {
    x = SQTable::Create(this->_sharedstate,0);
    ::SQObjectPtr::operator=(&this->_roottable,x);
    sq_base_register(this);
  }
  else {
    ::SQObjectPtr::operator=(&this->_roottable,(SQObjectPtr *)(stacksize_local + 0x60));
    ::SQObjectPtr::operator=(&this->_errorhandler,(SQObjectPtr *)(stacksize_local + 0x80));
    this->_debughook = (bool)(*(byte *)(stacksize_local + 0x90) & 1);
    this->_debughook_native = *(SQDEBUGHOOK *)(stacksize_local + 0x98);
    ::SQObjectPtr::operator=(&this->_debughook_closure,(SQObjectPtr *)(stacksize_local + 0xa0));
  }
  return true;
}

Assistant:

bool SQVM::Init(SQVM *friendvm, SQInteger stacksize)
{
    _stack.resize(stacksize);
    _alloccallsstacksize = 4;
    _callstackdata.resize(_alloccallsstacksize);
    _callsstacksize = 0;
    _callsstack = &_callstackdata[0];
    _stackbase = 0;
    _top = 0;
    if(!friendvm) {
        _roottable = SQTable::Create(_ss(this), 0);
        sq_base_register(this);
    }
    else {
        _roottable = friendvm->_roottable;
        _errorhandler = friendvm->_errorhandler;
        _debughook = friendvm->_debughook;
        _debughook_native = friendvm->_debughook_native;
        _debughook_closure = friendvm->_debughook_closure;
    }


    return true;
}